

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# average.hpp
# Opt level: O3

void __thiscall
vista::circular::example::average<double,_4UL>::push(average<double,_4UL> *this,value_type input)

{
  circular_view<double,_4UL> *this_00;
  reference pdVar1;
  size_type sVar2;
  size_type sVar3;
  
  this_00 = &(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>;
  sVar2 = (this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.size;
  if (sVar2 == 4) {
    pdVar1 = circular_view<double,_4UL>::front(this_00);
    this->sum = (input - *pdVar1) + this->sum;
    sVar2 = (this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.size;
  }
  else {
    this->sum = this->sum + input;
  }
  (this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.next =
       (ulong)((int)(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.
                    member.next + 1U & 3) | 4;
  sVar3 = sVar2 + 1;
  if (sVar2 == 4) {
    sVar3 = 4;
  }
  (this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.size = sVar3;
  pdVar1 = circular_view<double,_4UL>::back(this_00);
  *pdVar1 = input;
  return;
}

Assistant:

void push(value_type input) noexcept(std::is_nothrow_move_assignable<value_type>::value)
    {
        // Update the running sum
        if (window::full())
        {
            // Undo the effect of the entry leaving the window
            sum += input - window::front();
        }
        else
        {
            sum += input;
        }
        // Remember the input value for later use
        window::push_back(input);
    }